

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

MCode * lj_mcode_patch(jit_State *J,MCode *ptr,int finish)

{
  size_t sz;
  int iVar1;
  jit_State *local_30;
  MCode *mc;
  int finish_local;
  MCode *ptr_local;
  jit_State *J_local;
  
  if (finish == 0) {
    local_30 = (jit_State *)J->mcarea;
    if ((ptr < local_30) || ((MCode *)((long)&(local_30->cur).nextgc.gcptr64 + J->szmcarea) <= ptr))
    {
      do {
        do {
          local_30 = (jit_State *)(local_30->cur).nextgc.gcptr64;
        } while (ptr < local_30);
      } while ((MCode *)((long)&(local_30->cur).nextgc.gcptr64 + *(long *)&(local_30->cur).marked)
               <= ptr);
      sz._0_1_ = (local_30->cur).marked;
      sz._1_1_ = (local_30->cur).gct;
      sz._2_2_ = (local_30->cur).nsnap;
      sz._4_4_ = (local_30->cur).nins;
      iVar1 = mcode_setprot(local_30,sz,3);
      J_local = local_30;
      if (iVar1 != 0) {
        mcode_protfail(J);
      }
    }
    else {
      mcode_protect(J,3);
      J_local = local_30;
    }
  }
  else {
    if (J->mcarea == ptr) {
      mcode_protect(J,5);
    }
    else {
      iVar1 = mcode_setprot(ptr,*(size_t *)(ptr + 8),5);
      if (iVar1 != 0) {
        mcode_protfail(J);
      }
    }
    J_local = (jit_State *)0x0;
  }
  return (MCode *)J_local;
}

Assistant:

MCode *lj_mcode_patch(jit_State *J, MCode *ptr, int finish)
{
  if (finish) {
#if LUAJIT_SECURITY_MCODE
    if (J->mcarea == ptr)
      mcode_protect(J, MCPROT_RUN);
    else if (LJ_UNLIKELY(mcode_setprot(ptr, ((MCLink *)ptr)->size, MCPROT_RUN)))
      mcode_protfail(J);
#endif
    return NULL;
  } else {
    MCode *mc = J->mcarea;
    /* Try current area first to use the protection cache. */
    if (ptr >= mc && ptr < (MCode *)((char *)mc + J->szmcarea)) {
#if LUAJIT_SECURITY_MCODE
      mcode_protect(J, MCPROT_GEN);
#endif
      return mc;
    }
    /* Otherwise search through the list of MCode areas. */
    for (;;) {
      mc = ((MCLink *)mc)->next;
      lj_assertJ(mc != NULL, "broken MCode area chain");
      if (ptr >= mc && ptr < (MCode *)((char *)mc + ((MCLink *)mc)->size)) {
#if LUAJIT_SECURITY_MCODE
	if (LJ_UNLIKELY(mcode_setprot(mc, ((MCLink *)mc)->size, MCPROT_GEN)))
	  mcode_protfail(J);
#endif
	return mc;
      }
    }
  }
}